

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_retry_control.c
# Opt level: O1

RETRY_CONTROL_HANDLE
retry_control_create(IOTHUB_CLIENT_RETRY_POLICY policy,uint max_retry_time_in_secs)

{
  RETRY_CONTROL_HANDLE __ptr;
  TICK_COUNTER_HANDLE pTVar1;
  LOGGER_LOG p_Var2;
  RETRY_CONTROL_INSTANCE *retry_control;
  
  __ptr = (RETRY_CONTROL_HANDLE)malloc(0x38);
  if (__ptr == (RETRY_CONTROL_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                ,"retry_control_create",0x125,1,"Failed creating the retry control (malloc failed)")
      ;
      return (RETRY_CONTROL_HANDLE)0x0;
    }
  }
  else {
    __ptr->first_retry_tick_seconds = 0;
    __ptr->last_retry_tick_seconds = 0;
    __ptr->max_delay_in_secs = 0;
    __ptr->retry_count = 0;
    __ptr->tick_counter = (TICK_COUNTER_HANDLE)0x0;
    __ptr->policy = IOTHUB_CLIENT_RETRY_NONE;
    __ptr->max_retry_time_in_secs = 0;
    __ptr->initial_wait_time_in_secs = 0;
    __ptr->max_jitter_percent = 0;
    *(undefined8 *)&__ptr->current_wait_time_in_secs = 0;
    pTVar1 = tickcounter_create();
    __ptr->tick_counter = pTVar1;
    if (pTVar1 != (TICK_COUNTER_HANDLE)0x0) {
      __ptr->policy = policy;
      __ptr->max_retry_time_in_secs = max_retry_time_in_secs;
      __ptr->initial_wait_time_in_secs =
           (uint)((policy & ~IOTHUB_CLIENT_RETRY_IMMEDIATE) !=
                 IOTHUB_CLIENT_RETRY_EXPONENTIAL_BACKOFF) * 4 + 1;
      __ptr->max_jitter_percent = 5;
      __ptr->max_delay_in_secs = 0x1e;
      __ptr->retry_count = 0;
      __ptr->current_wait_time_in_secs = 0;
      *(undefined4 *)&__ptr->first_retry_tick_seconds = 0xffffffff;
      *(undefined4 *)((long)&__ptr->first_retry_tick_seconds + 4) = 0xffffffff;
      *(undefined4 *)&__ptr->last_retry_tick_seconds = 0xffffffff;
      *(undefined4 *)((long)&__ptr->last_retry_tick_seconds + 4) = 0xffffffff;
      return __ptr;
    }
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_retry_control.c"
                ,"retry_control_create",300,1,
                "Failed creating the retry controller (tickcounter_create failed)");
    }
    free(__ptr);
  }
  return (RETRY_CONTROL_HANDLE)0x0;
}

Assistant:

RETRY_CONTROL_HANDLE retry_control_create(IOTHUB_CLIENT_RETRY_POLICY policy, unsigned int max_retry_time_in_secs)
{
    RETRY_CONTROL_INSTANCE* retry_control;

    if ((retry_control = (RETRY_CONTROL_INSTANCE*)malloc(sizeof(RETRY_CONTROL_INSTANCE))) == NULL)
    {
        LogError("Failed creating the retry control (malloc failed)");
    }
    else
    {
        memset(retry_control, 0, sizeof(RETRY_CONTROL_INSTANCE));
        if ((retry_control->tick_counter = tickcounter_create()) == NULL)
        {
            LogError("Failed creating the retry controller (tickcounter_create failed)");
            free(retry_control);
            retry_control = NULL;
        }
        else
        {
            retry_control->policy = policy;
            retry_control->max_retry_time_in_secs = max_retry_time_in_secs;

            if (retry_control->policy == IOTHUB_CLIENT_RETRY_EXPONENTIAL_BACKOFF ||
                retry_control->policy == IOTHUB_CLIENT_RETRY_EXPONENTIAL_BACKOFF_WITH_JITTER)
            {
                retry_control->initial_wait_time_in_secs = 1;
            }
            else
            {
                retry_control->initial_wait_time_in_secs = 5;
            }

            retry_control->max_jitter_percent = 5;
            retry_control->max_delay_in_secs = DEFAULT_MAX_DELAY_IN_SECS;

            retry_control_reset(retry_control);
        }
    }

    return (RETRY_CONTROL_HANDLE)retry_control;
}